

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O3

void __thiscall undo::UndoHistory::add(UndoHistory *this,UndoCommand *cmd)

{
  UndoState *pUVar1;
  UndoState *pUVar2;
  
  pUVar2 = (UndoState *)operator_new(0x20);
  pUVar2->m_cmd = cmd;
  pUVar1 = this->m_last;
  pUVar2->m_prev = pUVar1;
  pUVar2->m_next = (UndoState *)0x0;
  pUVar2->m_parent = this->m_cur;
  if (this->m_first == (UndoState *)0x0) {
    this->m_first = pUVar2;
  }
  this->m_last = pUVar2;
  this->m_cur = pUVar2;
  if (pUVar1 != (UndoState *)0x0) {
    if (pUVar1->m_next != (UndoState *)0x0) {
      __assert_fail("!state->m_prev->m_next",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp"
                    ,0x9b,"void undo::UndoHistory::add(UndoCommand *)");
    }
    pUVar1->m_next = pUVar2;
  }
  return;
}

Assistant:

void UndoHistory::add(UndoCommand* cmd)
{
  UndoState* state = new UndoState(cmd);
  state->m_prev = m_last;
  state->m_next = nullptr;
  state->m_parent = m_cur;

  if (!m_first)
    m_first = state;

  m_cur = m_last = state;

  if (state->m_prev) {
    assert(!state->m_prev->m_next);
    state->m_prev->m_next = state;
  }
}